

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgConstructSurrogate.hpp
# Opt level: O2

void TasGrid::constructCommon<false,false>
               (ModelSignature *model,size_t max_num_points,size_t num_parallel_jobs,
               size_t max_samples_per_job,TasmanianSparseGrid *grid,
               function<std::vector<double,_std::allocator<double>_>_(TasGrid::TasmanianSparseGrid_&)>
               *candidates,string *checkpoint_filename)

{
  BaseCanonicalGrid *pBVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  runtime_error *this;
  int iVar5;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  long lVar6;
  size_type sVar7;
  size_t remaining_budget;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong local_5c0;
  vector<double,_std::allocator<double>_> x;
  CompleteStorage complete;
  size_t num_outputs;
  string filename;
  vector<double,_std::allocator<double>_> y;
  anon_class_16_2_592c7d46 load_complete;
  anon_class_24_3_1d86c3a8 set_initial_guess;
  CandidateManager manager;
  string filename_old;
  _Vector_base<double,_std::allocator<double>_> local_458;
  anon_class_32_4_2882b012 refresh_candidates;
  int aiStack_420 [122];
  anon_class_24_3_de235a21 checkpoint;
  
  __nbytes = max_samples_per_job + (max_samples_per_job == 0);
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    local_5c0 = 0;
    num_outputs = 0;
  }
  else {
    local_5c0 = (ulong)*(int *)(pBVar1 + 0x10);
    num_outputs = (size_t)*(int *)(pBVar1 + 0x14);
  }
  manager.num_candidates = 0;
  manager.num_running = 0;
  manager.num_done = 0;
  manager.candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  manager.candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  manager.candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager.sorted.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  manager.sorted.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  manager.sorted.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager.status.
  super__Vector_base<TasGrid::CandidateManager::TypeStatus,_std::allocator<TasGrid::CandidateManager::TypeStatus>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager.status.
  super__Vector_base<TasGrid::CandidateManager::TypeStatus,_std::allocator<TasGrid::CandidateManager::TypeStatus>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager.status.
  super__Vector_base<TasGrid::CandidateManager::TypeStatus,_std::allocator<TasGrid::CandidateManager::TypeStatus>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager.running_jobs.
  super__Fwd_list_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl._M_head._M_next =
       (_Fwd_list_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )(_Fwd_list_impl)0x0;
  complete.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  complete.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  complete.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  complete.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  complete.num_dimensions = local_5c0;
  manager.num_dimensions = local_5c0;
  manager.num_batch = __nbytes;
  std::__cxx11::string::string((string *)&filename,(string *)checkpoint_filename);
  std::operator+(&filename_old,checkpoint_filename,"_old");
  if (filename._M_string_length != 0) {
    std::ifstream::ifstream(&refresh_candidates,(string *)&filename,_S_bin);
    if (*(int *)((long)aiStack_420 + (long)refresh_candidates.load_complete[-2].grid) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"missing main checkpoint");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TasGrid::TasmanianSparseGrid::read((istream *)grid,SUB81(&refresh_candidates,0));
    CompleteStorage::read(&complete,(int)&refresh_candidates,__buf,__nbytes);
    std::ifstream::~ifstream(&refresh_candidates);
    if (filename._M_string_length != 0) {
      std::ofstream::ofstream(&refresh_candidates,(string *)&filename,_S_bin);
      TasGrid::TasmanianSparseGrid::write((ostream *)grid,SUB81(&refresh_candidates,0));
      CompleteStorage::write(&complete,(int)&refresh_candidates,__buf_00,__nbytes);
      std::ofstream::~ofstream(&refresh_candidates);
    }
  }
  load_complete.complete = &complete;
  refresh_candidates.load_complete = &load_complete;
  refresh_candidates.manager = &manager;
  uVar2 = (ulong)((long)complete.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)complete.points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) / complete.num_dimensions;
  lVar6 = 0;
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    iVar5 = *(int *)(pBVar1 + 0x14);
    if (iVar5 != 0) {
      iVar5 = *(int *)(pBVar1 + 0x20);
    }
    lVar6 = (long)iVar5;
  }
  set_initial_guess.num_outputs = &num_outputs;
  set_initial_guess.num_dimensions = &local_5c0;
  load_complete.grid = grid;
  set_initial_guess.grid = grid;
  refresh_candidates.candidates = candidates;
  refresh_candidates.grid = grid;
  checkpoint.filename = &filename;
  checkpoint.grid = grid;
  checkpoint.complete = load_complete.complete;
  if (grid->using_dynamic_construction == false) {
    TasGrid::TasmanianSparseGrid::beginConstruction();
  }
  constructCommon<false,_false>::anon_class_32_4_2882b012::operator()(&refresh_candidates);
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = (size_type)*(int *)(pBVar1 + 0x10);
  }
  std::vector<double,_std::allocator<double>_>::vector(&x,sVar7,(allocator_type *)&y);
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = (size_type)*(int *)(pBVar1 + 0x14);
  }
  std::vector<double,_std::allocator<double>_>::vector(&y,sVar7,(allocator_type *)&local_458);
  uVar2 = lVar6 + uVar2;
  while ((remaining_budget = max_num_points - uVar2,
         uVar2 <= max_num_points && remaining_budget != 0 && (manager.num_candidates != 0))) {
    CandidateManager::next
              ((vector<double,_std::allocator<double>_> *)&local_458,&manager,remaining_budget);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&x,&local_458);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_458);
    if (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      constructCommon<false,_false>::anon_class_32_4_2882b012::operator()(&refresh_candidates);
      CandidateManager::next
                ((vector<double,_std::allocator<double>_> *)&local_458,&manager,remaining_budget);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&x,&local_458);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_458);
    }
    if (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar3 = (ulong)((long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) / local_5c0;
      constructCommon<false,_false>::anon_class_24_3_1d86c3a8::operator()(&set_initial_guess,&x,&y);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
      ::operator()(model,&x,&y,0);
      CompleteStorage::add(&complete,&x,&y);
      CandidateManager::complete(&manager,&x);
      pBVar1 = (grid->base)._M_t.
               super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
      if (((pBVar1 == (BaseCanonicalGrid *)0x0) ||
          (*(int *)(pBVar1 + 0x20) < 1000 || *(int *)(pBVar1 + 0x14) == 0)) ||
         (uVar4 = (ulong)((long)complete.points.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)complete.points.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) /
                  complete.num_dimensions, auVar8._8_4_ = (int)(uVar4 >> 0x20), auVar8._0_8_ = uVar4
         , auVar8._12_4_ = 0x45300000,
         0.2 < ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) /
               (double)*(int *)(pBVar1 + 0x20))) {
        constructCommon<false,_false>::anon_class_16_2_592c7d46::operator()(&load_complete);
      }
      uVar2 = uVar3 + uVar2;
      auVar9._8_4_ = (int)(manager.num_done >> 0x20);
      auVar9._0_8_ = manager.num_done;
      auVar9._12_4_ = 0x45300000;
      auVar10._8_4_ = (int)(manager.num_candidates >> 0x20);
      auVar10._0_8_ = manager.num_candidates;
      auVar10._12_4_ = 0x45300000;
      if (0.2 < ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)manager.num_done) - 4503599627370496.0)) /
                ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)manager.num_candidates) - 4503599627370496.0))) {
        constructCommon<false,_false>::anon_class_32_4_2882b012::operator()(&refresh_candidates);
      }
    }
    constructCommon<false,_false>::anon_class_24_3_de235a21::operator()(&checkpoint);
  }
  constructCommon<false,_false>::anon_class_16_2_592c7d46::operator()(&load_complete);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&filename_old);
  std::__cxx11::string::~string((string *)&filename);
  CompleteStorage::~CompleteStorage(&complete);
  CandidateManager::~CandidateManager(&manager);
  return;
}

Assistant:

void constructCommon(ModelSignature model,
                     size_t max_num_points, size_t num_parallel_jobs, size_t max_samples_per_job,
                     TasmanianSparseGrid &grid,
                     std::function<std::vector<double>(TasmanianSparseGrid &)> candidates,
                     std::string const &checkpoint_filename){

    num_parallel_jobs   = std::max(size_t(1), num_parallel_jobs);
    max_samples_per_job = std::max(size_t(1), max_samples_per_job);
    size_t num_dimensions = (size_t) grid.getNumDimensions();
    size_t num_outputs    = (size_t) grid.getNumOutputs();
    CandidateManager manager(num_dimensions, max_samples_per_job); // keeps track of started and ordered samples
    CompleteStorage complete(num_dimensions); // temporarily stores complete samples (batch loading is faster)

    std::string filename = checkpoint_filename;
    std::string filename_old = checkpoint_filename + "_old";

    if (!filename.empty()){ // recover from an existing checkpoint
        std::ifstream infile(filename, std::ios::binary);
        try{ // attempt to recover from filename
            if (!infile.good()) throw std::runtime_error("missing main checkpoint");
            grid.read(infile, mode_binary);
            complete.read(infile);
        }catch(std::runtime_error &){
            // main file is missing or is corrupt, try the older version
            std::ifstream oldfile(filename_old, std::ios::binary);
            try{
                if (!oldfile.good()) throw std::runtime_error("missing main checkpoint");
                grid.read(oldfile, mode_binary);
                complete.read(oldfile);
            }catch(std::runtime_error &){
                // nothing could be recovered, start over from the current grid
            }
        }
    }

    if (!filename.empty()){ // initial checkpoint
        std::ofstream ofs(filename, std::ios::binary);
        grid.write(ofs, mode_binary); // write grid to current
        complete.write(ofs);
    }

    // prepare several commonly used steps
    auto checkpoint = [&]()->void{ // keeps two saved states for the constructed grid
        if (!filename.empty()){
            { // copy current into old and write to current
                std::ifstream current_state(filename, std::ios::binary);
                std::ofstream previous_state(filename, std::ios::binary);
                previous_state << current_state.rdbuf();
            }
            std::ofstream ofs(filename, std::ios::binary);
            grid.write(ofs, mode_binary); // write grid to current
            complete.write(ofs);
        }
    };

    auto load_complete = [&]()->void{ // loads any complete points, does nothing if getNumStored() is zero
        if (complete.getNumStored() > 0)
            complete.load(grid);
    };

    auto refresh_candidates = [&]()->void{ // loads complete and asks for new candidates
        load_complete(); // always load before computing new candidates
        manager = candidates(grid); // get new candidates
    };

    size_t total_num_launched = complete.getNumStored() + grid.getNumLoaded(); // count all launched jobs, including the ones already complete
    auto checkout_sample = [&]()->std::vector<double>{ // get the "most-important" point that has not started yet
        auto x = manager.next(max_num_points - total_num_launched);
        if (x.empty()){ // did not find a job, maybe we need to refresh the candidates
            refresh_candidates();
            x = manager.next(max_num_points - total_num_launched); // if this is empty, then we have exhausted all possible candidates
        }
        return x;
    };

    // load the initial guess into y (is using initial guess), otherwise set y to the correct size
    auto set_initial_guess = [&](std::vector<double> const &x, std::vector<double> &y)->void{
        if (use_initial_guess){
            if (grid.getNumLoaded()) grid.evaluateBatch(x, y);
            else y.clear();
        }else{
            y.resize(num_outputs * (x.size() / num_dimensions));
        }
    };

    if (!grid.isUsingConstruction()) // the procedure assumes dynamic construction
        grid.beginConstruction();

    refresh_candidates();

    if (parallel_construction == mode_parallel){ // parallel version
        // allocate space for all x and y pairs, will be filled by workers and processed by main
        std::vector<std::vector<double>> x(num_parallel_jobs),
                                         y(num_parallel_jobs, std::vector<double>(max_samples_per_job * num_outputs));

        std::vector<int> work_flag(num_parallel_jobs);
        constexpr int flag_done = 0;
        constexpr int flag_computing = 1;
        constexpr int flag_shutdown = 2;

        std::condition_variable until_someone_done;
        std::condition_variable until_new_job;
        std::mutex access_count_done;
        int count_done = 0;

        // lambda that will handle the work
        auto do_work = [&](size_t thread_id)->void{

            int my_flag = flag_computing;
            while(my_flag == flag_computing){
                model(x[thread_id], y[thread_id], thread_id); // does the model evaluations

                { // must guarantee sync between work_flag and count_done, use a lock
                    std::lock_guard<std::mutex> lock(access_count_done);
                    work_flag[thread_id] = flag_done;
                    count_done++;
                }
                until_someone_done.notify_one(); // just finished some work, notify the main thread

                { // wait till the main thread gives us an new piece of work
                    std::unique_lock<std::mutex> lock(access_count_done);
                    until_new_job.wait(lock, [&]()->bool{ return (work_flag[thread_id] != flag_done); });
                    my_flag = work_flag[thread_id];
                }
            }
        };

        // launch initial set of jobs
        std::vector<std::thread> workers(num_parallel_jobs);
        for(size_t id=0; id<num_parallel_jobs; id++){
            x[id] = manager.next(max_num_points - total_num_launched);
            if (!x[id].empty()){
                total_num_launched += x[id].size() / num_dimensions;
                set_initial_guess(x[id], y[id]);
                work_flag[id] = flag_computing;
                workers[id] = std::thread(do_work, id);
            }else{
                work_flag[id] = flag_shutdown; // not enough samples, cancel the thread
            }
        }

        auto collect_finished = [&]()->bool{
            bool any_done = false;
            for(size_t id=0; id<num_parallel_jobs; id++){
                if (work_flag[id] == flag_done){
                    if (!x.empty()){ // shouldn't be empty
                        complete.add(x[id], y[id]);
                        manager.complete(x[id]);
                        any_done = true;
                    }
                    if ((grid.getNumLoaded() < 1000) || (double(complete.getNumStored()) / double(grid.getNumLoaded()) > 0.2))
                        load_complete(); // move from complete into the grid

                    if (total_num_launched < max_num_points){
                        // refresh the candidates if enough of the current candidates have completed
                        if (double(manager.getNumDone()) / double(manager.getNumCandidates()) > 0.2)
                            refresh_candidates();

                        x[id] = checkout_sample(); // if necessary this will call refresh_candidates()

                        if (!x[id].empty()){ // if empty, then we have finished all possible candidates (reached tolerance)
                            total_num_launched += x[id].size() / num_dimensions;
                            set_initial_guess(x[id], y[id]);
                            work_flag[id] = flag_computing;
                        }else{
                            work_flag[id] = flag_shutdown; // not enough samples, cancel the thread
                        }
                    }else{
                        work_flag[id] = flag_shutdown; // reached the budget, shutdown the thread
                    }
                }
            }
            return any_done;
        };

        while(manager.getNumRunning() > 0){ // main loop
            {   // lock access to the count_done variable
                std::unique_lock<std::mutex> lock(access_count_done);
                // unlock and wait until some else increments the "done" count
                until_someone_done.wait(lock, [&]()->bool{ return (count_done > 0); });
                // the lock is back on at this point, process the completed samples, reset the count and go back to waiting
                count_done = 0;
                if (collect_finished()) checkpoint(); // if new samples were computed, save the state
            } // unlock the access_count_done and notify that we have loaded new jobs
            // without the unlock, the threads will wake up but will not be able to read the worker flags
            until_new_job.notify_all();
        }

        load_complete(); // flush completed jobs

        for(auto &w : workers) if (w.joinable()) w.join(); // join all threads

    }else{
        std::vector<double> x(grid.getNumDimensions()), y( grid.getNumOutputs());

        while((total_num_launched < max_num_points) && (manager.getNumCandidates() > 0)){
            x = manager.next(max_num_points - total_num_launched);
            if (x.empty()){ // need more candidates
                refresh_candidates();
                x = manager.next(max_num_points - total_num_launched); // if this is empty, then we have exhausted the candidates
            }
            if (!x.empty()){ // could be empty if there are no more candidates
                total_num_launched += x.size() / num_dimensions;
                set_initial_guess(x, y);
                model(x, y, 0); // compute a sample
                complete.add(x, y);
                manager.complete(x);

                // the fist thousand points can be loaded one at a time, then add when % increase of the grid is achieved
                if ((grid.getNumLoaded() < 1000) || (double(complete.getNumStored()) / double(grid.getNumLoaded()) > 0.2))
                    load_complete(); // also does checkpoint save
                // if done with the top % of the grid points, recompute the candidates
                if (double(manager.getNumDone()) / double(manager.getNumCandidates()) > 0.2)
                    refresh_candidates();
            }
            checkpoint();
        }

        load_complete(); // flush completed jobs
    }
}